

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O2

_Bool ksGpuWindow_Create(ksGpuWindow *window,ksDriverInstance *instance,ksGpuQueueInfo *queueInfo,
                        int queueIndex,ksGpuSurfaceColorFormat colorFormat,
                        ksGpuSurfaceDepthFormat depthFormat,ksGpuSampleCount sampleCount,int width,
                        int height,_Bool fullscreen)

{
  float *currentRefreshRate;
  undefined1 auVar1 [16];
  ksGpuDevice *pkVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ksGpuSampleCount kVar6;
  uint32_t uVar7;
  ksGpuSurfaceBits kVar8;
  Display *pDVar9;
  Window WVar10;
  XVisualInfo *pXVar11;
  undefined8 uVar12;
  undefined8 *puVar13;
  GLXContext p_Var14;
  long lVar15;
  ksGpuQueueInfo *pkVar16;
  char *pcVar17;
  uint uVar18;
  long lVar19;
  _Bool _Var20;
  byte bVar21;
  uint local_148;
  uint local_140;
  int glxEventBase;
  ulong local_130;
  int fbConfigCount;
  int glxVersionMinor;
  int glxVersionMajor;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  int glxErrorBase;
  undefined4 local_48;
  
  bVar21 = 0;
  memset(window,0,0x228);
  local_130 = CONCAT44(local_130._4_4_,colorFormat);
  window->colorFormat = colorFormat;
  window->depthFormat = depthFormat;
  window->sampleCount = sampleCount;
  window->windowWidth = width;
  window->windowHeight = height;
  window->windowSwapInterval = 1;
  window->windowRefreshRate = 60.0;
  window->windowFullscreen = fullscreen;
  window->windowExit = false;
  pDVar9 = (Display *)XOpenDisplay(0);
  window->xDisplay = pDVar9;
  if (pDVar9 == (Display *)0x0) {
    Error("Unable to open X Display.");
    return false;
  }
  iVar3 = XDefaultScreen(pDVar9);
  window->xScreen = iVar3;
  WVar10 = XRootWindow(window->xDisplay,iVar3);
  window->xRoot = WVar10;
  currentRefreshRate = &window->desktopRefreshRate;
  if (window->windowFullscreen == true) {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
               currentRefreshRate,&window->windowWidth,&window->windowHeight,
               &window->windowRefreshRate);
  }
  else {
    ChangeVideoMode_XF86VidMode
              (window->xDisplay,window->xScreen,&window->desktopWidth,&window->desktopHeight,
               currentRefreshRate,(int *)0x0,(int *)0x0,(float *)0x0);
    window->windowRefreshRate = *currentRefreshRate;
  }
  pkVar2 = &window->device;
  (pkVar2->queueInfo).queuePriorities[10] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[0xb] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[0xc] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[0xd] = KS_GPU_QUEUE_PRIORITY_LOW;
  pkVar2 = &window->device;
  (pkVar2->queueInfo).queuePriorities[6] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[7] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[8] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[9] = KS_GPU_QUEUE_PRIORITY_LOW;
  pkVar2 = &window->device;
  (pkVar2->queueInfo).queuePriorities[2] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[3] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[4] = KS_GPU_QUEUE_PRIORITY_LOW;
  (pkVar2->queueInfo).queuePriorities[5] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queueCount = 0;
  (window->device).queueInfo.queueProperties = 0;
  (window->device).queueInfo.queuePriorities[0] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[1] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xe] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).queueInfo.queuePriorities[0xf] = KS_GPU_QUEUE_PRIORITY_LOW;
  (window->device).instance = instance;
  pkVar16 = &(window->device).queueInfo;
  for (lVar15 = 0x12; lVar15 != 0; lVar15 = lVar15 + -1) {
    pkVar16->queueCount = queueInfo->queueCount;
    queueInfo = (ksGpuQueueInfo *)((long)queueInfo + (ulong)bVar21 * -8 + 4);
    pkVar16 = (ksGpuQueueInfo *)((long)pkVar16 + (ulong)bVar21 * -8 + 4);
  }
  pDVar9 = window->xDisplay;
  iVar3 = window->xScreen;
  (window->context).device = &window->device;
  iVar4 = glXQueryExtension(pDVar9,&glxErrorBase,&glxEventBase);
  if (iVar4 == 0) {
    pcVar17 = "X display does not support the GLX extension.";
  }
  else {
    iVar4 = glXQueryVersion(pDVar9,&glxVersionMajor,&glxVersionMinor);
    if (iVar4 == 0) {
      pcVar17 = "Unable to retrieve GLX version.";
    }
    else {
      fbConfigCount = 0;
      lVar15 = glXGetFBConfigs(pDVar9,iVar3,&fbConfigCount);
      iVar3 = fbConfigCount;
      if (fbConfigCount != 0) {
        kVar8 = ksGpuContext_BitsForSurfaceFormat((ksGpuSurfaceColorFormat)local_130,depthFormat);
        uVar18 = kVar8._0_4_;
        local_130 = (ulong)(ushort)(kVar8._4_2_ >> 8);
        local_140 = uVar18 >> 8 & 0xff;
        local_148 = uVar18 >> 0x10 & 0xff;
        for (lVar19 = 0; lVar19 < iVar3; lVar19 = lVar19 + 1) {
          iVar3 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x8013);
          if ((((((iVar3 != 0) &&
                 (iVar3 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x800b)
                 , iVar3 != 0)) &&
                (iVar3 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),5),
                iVar3 != 0)) &&
               ((uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x8011),
                (uVar5 & 1) != 0 &&
                (uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x8010),
                (uVar5 & 1) != 0)))) &&
              ((uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),8),
               uVar5 == (uVar18 & 0xff) &&
               ((uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),9),
                uVar5 == local_140 &&
                (uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),10),
                uVar5 == local_148)))))) &&
             (uVar5 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0xb),
             uVar5 == uVar18 >> 0x18)) {
            iVar3 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0xc);
            if ((iVar3 == (ksGpuSurfaceColorFormat)local_130) &&
               ((sampleCount < KS_GPU_SAMPLE_COUNT_2 ||
                ((iVar3 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),100000)
                 , iVar3 == 1 &&
                 (kVar6 = glxGetFBConfigAttrib2
                                    (pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x186a1),
                 kVar6 == sampleCount)))))) {
              uVar7 = glxGetFBConfigAttrib2(pDVar9,*(GLXFBConfig *)(lVar15 + lVar19 * 8),0x800b);
              (window->context).visualid = uVar7;
              (window->context).glxFBConfig = *(GLXFBConfig *)(lVar15 + lVar19 * 8);
              XFree(lVar15);
              (window->context).xDisplay = pDVar9;
              local_108._8_8_ = 0x200002094;
              local_108._0_8_ = 0x100009126;
              local_118._8_8_ = 0x500002092;
              local_118._0_8_ = 0x400002091;
              auVar1._12_4_ = 0;
              auVar1._0_12_ = local_f8._4_12_;
              local_f8 = auVar1 << 0x20;
              glXCreateContextAttribsARB =
                   (PFNGLXCREATECONTEXTATTRIBSARBPROC)
                   glXGetProcAddress("glXCreateContextAttribsARB");
              p_Var14 = (*glXCreateContextAttribsARB)
                                  (pDVar9,(window->context).glxFBConfig,(GLXContext)0x0,1,
                                   (int *)local_118);
              (window->context).glxContext = p_Var14;
              if (p_Var14 == (GLXContext)0x0) {
                pcVar17 = "Unable to create GLX context.";
              }
              else {
                iVar3 = glXIsDirect(pDVar9,p_Var14);
                if (iVar3 != 0) goto LAB_001134d1;
                pcVar17 = "Unable to create direct rendering context.";
              }
              goto LAB_001134ca;
            }
          }
          iVar3 = fbConfigCount;
        }
        XFree(lVar15);
        Error("Failed to to find desired framebuffer configuration.");
        goto LAB_001134d1;
      }
      pcVar17 = "No valid framebuffer configurations found.";
    }
  }
LAB_001134ca:
  Error(pcVar17);
LAB_001134d1:
  pXVar11 = (XVisualInfo *)glXGetVisualFromFBConfig(window->xDisplay,(window->context).glxFBConfig);
  window->xVisual = pXVar11;
  if (pXVar11 == (XVisualInfo *)0x0) {
    pcVar17 = "Failed to retrieve visual for framebuffer config.";
    _Var20 = false;
  }
  else {
    local_b8._0_8_ = XCreateColormap(window->xDisplay,window->xRoot,pXVar11->visual,0);
    window->xColormap = local_b8._0_8_;
    local_c8 = (undefined1  [16])0x0;
    local_e8 = (undefined1  [16])0x0;
    local_f8 = (undefined1  [16])0x0;
    local_108 = (undefined1  [16])0x0;
    local_118 = (undefined1  [16])0x0;
    local_b8._8_8_ = 0;
    local_d8 = ZEXT816(0x67803f) << 0x40;
    WVar10 = XCreateWindow(window->xDisplay,window->xRoot,0,0,window->windowWidth,
                           window->windowHeight,0,window->xVisual->depth,1,window->xVisual->visual,
                           (window->windowFullscreen ^ 1) * 8 + 0x2800,local_118);
    window->xWindow = WVar10;
    _Var20 = WVar10 != 0;
    if (_Var20) {
      uVar12 = XInternAtom(window->xDisplay,"_NET_WM_NAME",0);
      XChangeProperty(window->xDisplay,window->xWindow,uVar12,0x1f,8,0);
      if (window->windowFullscreen == true) {
        _glxEventBase = 1;
        uVar12 = XInternAtom(window->xDisplay,"_NET_WM_BYPASS_COMPOSITOR",0);
        XChangeProperty(window->xDisplay,window->xWindow,uVar12,6,0x20,0);
        local_48 = 1;
        XChangeWindowAttributes(window->xDisplay,window->xWindow,0x200);
        XMapRaised(window->xDisplay,window->xWindow);
        XMoveResizeWindow(window->xDisplay,window->xWindow,0,0,window->windowWidth,
                          window->windowHeight);
        XFlush(window->xDisplay);
        XGrabPointer(window->xDisplay,window->xWindow,1,0,1,1,window->xWindow,(undefined1  [16])0x0)
        ;
        XGrabKeyboard(window->xDisplay,window->xWindow,1,1,1,0);
      }
      else {
        puVar13 = (undefined8 *)XAllocSizeHints();
        *puVar13 = 0x30;
        iVar3 = window->windowWidth;
        iVar4 = window->windowHeight;
        *(int *)(puVar13 + 3) = iVar3;
        *(int *)((long)puVar13 + 0x1c) = iVar4;
        *(int *)(puVar13 + 4) = iVar3;
        *(int *)((long)puVar13 + 0x24) = iVar4;
        XSetWMNormalHints(window->xDisplay,window->xWindow,puVar13);
        XFree(puVar13);
        XMapRaised(window->xDisplay,window->xWindow);
        XMoveResizeWindow(window->xDisplay,window->xWindow,
                          (long)(window->desktopWidth - window->windowWidth) / 2 & 0xffffffff,
                          (long)(window->desktopHeight - window->windowHeight) / 2 & 0xffffffff);
        XFlush(window->xDisplay);
      }
      (window->context).glxDrawable = window->xWindow;
      ksGpuContext_SetCurrent(&window->context);
      return _Var20;
    }
    pcVar17 = "Failed to create window.";
  }
  Error(pcVar17);
  ksGpuWindow_Destroy(window);
  return _Var20;
}

Assistant:

bool ksGpuWindow_Create(ksGpuWindow *window, ksDriverInstance *instance, const ksGpuQueueInfo *queueInfo, const int queueIndex,
                        const ksGpuSurfaceColorFormat colorFormat, const ksGpuSurfaceDepthFormat depthFormat,
                        const ksGpuSampleCount sampleCount, const int width, const int height, const bool fullscreen) {
    memset(window, 0, sizeof(ksGpuWindow));

    window->colorFormat = colorFormat;
    window->depthFormat = depthFormat;
    window->sampleCount = sampleCount;
    window->windowWidth = width;
    window->windowHeight = height;
    window->windowSwapInterval = 1;
    window->windowRefreshRate = 60.0f;
    window->windowFullscreen = fullscreen;
    window->windowActive = false;
    window->windowExit = false;

    const char *displayName = NULL;
    window->xDisplay = XOpenDisplay(displayName);
    if (!window->xDisplay) {
        Error("Unable to open X Display.");
        return false;
    }

    window->xScreen = XDefaultScreen(window->xDisplay);
    window->xRoot = XRootWindow(window->xDisplay, window->xScreen);

    if (window->windowFullscreen) {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, &window->windowWidth, &window->windowHeight,
                                    &window->windowRefreshRate);
    } else {
        ChangeVideoMode_XF86VidMode(window->xDisplay, window->xScreen, &window->desktopWidth, &window->desktopHeight,
                                    &window->desktopRefreshRate, NULL, NULL, NULL);
        window->windowRefreshRate = window->desktopRefreshRate;
    }

    ksGpuDevice_Create(&window->device, instance, queueInfo);
    ksGpuContext_CreateForSurface(&window->context, &window->device, queueIndex, colorFormat, depthFormat, sampleCount,
                                  window->xDisplay, window->xScreen);

    window->xVisual = glXGetVisualFromFBConfig(window->xDisplay, window->context.glxFBConfig);
    if (window->xVisual == NULL) {
        Error("Failed to retrieve visual for framebuffer config.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    window->xColormap = XCreateColormap(window->xDisplay, window->xRoot, window->xVisual->visual, AllocNone);

    const unsigned long wamask = CWColormap | CWEventMask | (window->windowFullscreen ? 0 : CWBorderPixel);

    XSetWindowAttributes wa;
    memset(&wa, 0, sizeof(wa));
    wa.colormap = window->xColormap;
    wa.border_pixel = 0;
    wa.event_mask = StructureNotifyMask | PropertyChangeMask | ResizeRedirectMask | KeyPressMask | KeyReleaseMask |
                    ButtonPressMask | ButtonReleaseMask | FocusChangeMask | ExposureMask | VisibilityChangeMask | EnterWindowMask |
                    LeaveWindowMask;

    window->xWindow = XCreateWindow(window->xDisplay,         // Display * display
                                    window->xRoot,            // Window parent
                                    0,                        // int x
                                    0,                        // int y
                                    window->windowWidth,      // unsigned int width
                                    window->windowHeight,     // unsigned int height
                                    0,                        // unsigned int border_width
                                    window->xVisual->depth,   // int depth
                                    InputOutput,              // unsigned int class
                                    window->xVisual->visual,  // Visual * visual
                                    wamask,                   // unsigned long valuemask
                                    &wa);                     // XSetWindowAttributes * attributes

    if (!window->xWindow) {
        Error("Failed to create window.");
        ksGpuWindow_Destroy(window);
        return false;
    }

    // Change the window title.
    Atom _NET_WM_NAME = XInternAtom(window->xDisplay, "_NET_WM_NAME", False);
    XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_NAME, XA_STRING, 8, PropModeReplace,
                    (const unsigned char *)WINDOW_TITLE, strlen(WINDOW_TITLE));

    if (window->windowFullscreen) {
        // Bypass the compositor in fullscreen mode.
        const unsigned long bypass = 1;
        Atom _NET_WM_BYPASS_COMPOSITOR = XInternAtom(window->xDisplay, "_NET_WM_BYPASS_COMPOSITOR", False);
        XChangeProperty(window->xDisplay, window->xWindow, _NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32, PropModeReplace,
                        (const unsigned char *)&bypass, 1);

        // Completely disassociate window from window manager.
        XSetWindowAttributes attributes;
        attributes.override_redirect = True;
        XChangeWindowAttributes(window->xDisplay, window->xWindow, CWOverrideRedirect, &attributes);

        // Make the window visible.
        XMapRaised(window->xDisplay, window->xWindow);
        XMoveResizeWindow(window->xDisplay, window->xWindow, 0, 0, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);

        // Grab mouse and keyboard input now that the window is disassociated from the window manager.
        XGrabPointer(window->xDisplay, window->xWindow, True, 0, GrabModeAsync, GrabModeAsync, window->xWindow, 0L, CurrentTime);
        XGrabKeyboard(window->xDisplay, window->xWindow, True, GrabModeAsync, GrabModeAsync, CurrentTime);
    } else {
        // Make the window fixed size.
        XSizeHints *hints = XAllocSizeHints();
        hints->flags = (PMinSize | PMaxSize);
        hints->min_width = window->windowWidth;
        hints->max_width = window->windowWidth;
        hints->min_height = window->windowHeight;
        hints->max_height = window->windowHeight;
        XSetWMNormalHints(window->xDisplay, window->xWindow, hints);
        XFree(hints);

        // First map the window and then center the window on the screen.
        XMapRaised(window->xDisplay, window->xWindow);
        const int x = (window->desktopWidth - window->windowWidth) / 2;
        const int y = (window->desktopHeight - window->windowHeight) / 2;
        XMoveResizeWindow(window->xDisplay, window->xWindow, x, y, window->windowWidth, window->windowHeight);
        XFlush(window->xDisplay);
    }

    window->context.glxDrawable = window->xWindow;

    ksGpuContext_SetCurrent(&window->context);

    return true;
}